

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

_Bool Curl_is_absolute_url(char *url,char *buf,size_t buflen)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  ulong uStack_30;
  char s;
  size_t i;
  size_t buflen_local;
  char *buf_local;
  char *url_local;
  
  uStack_30 = 0;
  while( true ) {
    bVar3 = false;
    if (uStack_30 < buflen) {
      bVar3 = url[uStack_30] != '\0';
    }
    if (!bVar3) {
      return false;
    }
    bVar1 = url[uStack_30];
    if (bVar1 == 0x3a) {
      if (buf != (char *)0x0) {
        buf[uStack_30] = '\0';
      }
      return true;
    }
    iVar2 = Curl_isalnum((uint)bVar1);
    if ((((iVar2 == 0) && (bVar1 != 0x2b)) && (bVar1 != 0x2d)) && (bVar1 != 0x2e)) break;
    if (buf != (char *)0x0) {
      iVar2 = tolower((uint)bVar1);
      buf[uStack_30] = (char)iVar2;
    }
    uStack_30 = uStack_30 + 1;
  }
  return false;
}

Assistant:

bool Curl_is_absolute_url(const char *url, char *buf, size_t buflen)
{
  size_t i;
#ifdef WIN32
  if(STARTS_WITH_DRIVE_PREFIX(url))
    return FALSE;
#endif
  for(i = 0; i < buflen && url[i]; ++i) {
    char s = url[i];
    if(s == ':') {
      if(buf)
        buf[i] = 0;
      return TRUE;
    }
    /* RFC 3986 3.1 explains:
      scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
    */
    else if(ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') ) {
      if(buf)
        buf[i] = (char)TOLOWER(s);
    }
    else
      break;
  }
  return FALSE;
}